

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.h
# Opt level: O1

void __thiscall
spvtools::opt::InstructionFolder::InstructionFolder(InstructionFolder *this,IRContext *context)

{
  _Rb_tree_header *p_Var1;
  ConstantFoldingRules *pCVar2;
  FoldingRules *this_00;
  
  this->context_ = context;
  pCVar2 = (ConstantFoldingRules *)operator_new(0x90);
  pCVar2->_vptr_ConstantFoldingRules = (_func_int **)&PTR__ConstantFoldingRules_0094ee08;
  (pCVar2->rules_)._M_h._M_buckets = &(pCVar2->rules_)._M_h._M_single_bucket;
  (pCVar2->rules_)._M_h._M_bucket_count = 1;
  (pCVar2->rules_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pCVar2->rules_)._M_h._M_element_count = 0;
  (pCVar2->rules_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pCVar2->rules_)._M_h._M_rehash_policy._M_next_resize = 0;
  (pCVar2->rules_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(pCVar2->ext_rules_)._M_t._M_impl.super__Rb_tree_header;
  (pCVar2->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pCVar2->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pCVar2->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pCVar2->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pCVar2->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar2->context_ = context;
  *(undefined8 *)
   &(pCVar2->empty_vector_).
    super__Vector_base<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ._M_impl = 0;
  (pCVar2->empty_vector_).
  super__Vector_base<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar2->empty_vector_).
  super__Vector_base<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->const_folding_rules_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl = pCVar2;
  this_00 = (FoldingRules *)operator_new(0x90);
  this_00->_vptr_FoldingRules = (_func_int **)&PTR__FoldingRules_009504e8;
  (this_00->rules_)._M_h._M_buckets = &(this_00->rules_)._M_h._M_single_bucket;
  (this_00->rules_)._M_h._M_bucket_count = 1;
  (this_00->rules_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->rules_)._M_h._M_element_count = 0;
  (this_00->rules_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->rules_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->rules_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this_00->ext_rules_)._M_t._M_impl.super__Rb_tree_header;
  (this_00->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this_00->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this_00->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this_00->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00->context_ = context;
  (this_00->empty_vector_).
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->empty_vector_).
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->empty_vector_).
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->folding_rules_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl = this_00;
  FoldingRules::AddFoldingRules(this_00);
  (*((this->const_folding_rules_)._M_t.
     super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
     ._M_t.
     super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
     .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl)->
    _vptr_ConstantFoldingRules[2])();
  return;
}

Assistant:

explicit InstructionFolder(IRContext* context)
      : context_(context),
        const_folding_rules_(new ConstantFoldingRules(context)),
        folding_rules_(new FoldingRules(context)) {
    folding_rules_->AddFoldingRules();
    const_folding_rules_->AddFoldingRules();
  }